

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

void __thiscall
ddd::DictionaryMLT<false,_true>::DictionaryMLT
          (DictionaryMLT<false,_true> *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *prefixes)

{
  pointer __p;
  pointer local_20;
  
  *(undefined ***)this = &PTR__DictionaryMLT_0013aa88;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined4 *)(this + 0x28) = 0xffffffff;
  *(undefined8 *)(this + 0x30) = 0;
  make_unique<ddd::DaTrie<false,true,true>,std::vector<char_const*,std::allocator<char_const*>>const&>
            ((ddd *)&local_20,prefixes);
  __p = local_20;
  local_20 = (pointer)0x0;
  std::
  __uniq_ptr_impl<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
  ::reset((__uniq_ptr_impl<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
           *)(this + 8),__p);
  std::
  unique_ptr<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
  ::~unique_ptr((unique_ptr<ddd::DaTrie<false,_true,_true>,_std::default_delete<ddd::DaTrie<false,_true,_true>_>_>
                 *)&local_20);
  return;
}

Assistant:

DictionaryMLT(const std::vector<const char*>& prefixes) {
    prefix_subtrie_ = make_unique<PrefixTrieType>(prefixes);
  }